

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::detail::checkIfShouldThrow(Enum at)

{
  bool bVar1;
  int result;
  int iVar2;
  long lVar3;
  
  bVar1 = true;
  if ((at & is_require) == 0) {
    if (((at & is_check) != 0) && (0 < *(int *)(g_cs + 100))) {
      iVar2 = 0;
      lVar3 = 0;
      do {
        iVar2 = iVar2 + *(int *)(g_cs + 0x8b8 + lVar3);
        lVar3 = lVar3 + 0x40;
      } while (lVar3 != 0x800);
      if (*(int *)(g_cs + 100) <= iVar2 + *(int *)(g_cs + 0x9c)) {
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool checkIfShouldThrow(assertType::Enum at) {
        if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
            return true;

        if((at & assertType::is_check) //!OCLINT bitwise operator in conditional
           && getContextOptions()->abort_after > 0 &&
           (g_cs->numAssertsFailed + g_cs->numAssertsFailedCurrentTest_atomic) >=
                   getContextOptions()->abort_after)
            return true;

        return false;
    }